

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pasteboard.c
# Opt level: O3

void wpe_pasteboard_string_vector_free(wpe_pasteboard_string_vector *vector)

{
  undefined8 *puVar1;
  wpe_pasteboard_string *pwVar2;
  long lVar3;
  ulong uVar4;
  
  pwVar2 = vector->strings;
  if (pwVar2 != (wpe_pasteboard_string *)0x0) {
    if (vector->length != 0) {
      lVar3 = 0;
      uVar4 = 0;
      do {
        pwVar2 = vector->strings;
        free(*(void **)((long)&pwVar2->data + lVar3));
        puVar1 = (undefined8 *)((long)&pwVar2->data + lVar3);
        *puVar1 = 0;
        puVar1[1] = 0;
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 0x10;
      } while (uVar4 < vector->length);
      pwVar2 = vector->strings;
    }
    free(pwVar2);
  }
  vector->strings = (wpe_pasteboard_string *)0x0;
  vector->length = 0;
  return;
}

Assistant:

void
wpe_pasteboard_string_vector_free(struct wpe_pasteboard_string_vector* vector)
{
    if (vector->strings) {
        for (uint64_t i = 0; i < vector->length; ++i)
            wpe_pasteboard_string_free(&vector->strings[i]);
        wpe_free(vector->strings);
    }
    vector->strings = 0;
    vector->length = 0;
}